

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

void __thiscall ON_FontList::ON_FontList(ON_FontList *this)

{
  ON_FontListImpl *this_00;
  
  this->m_name_locale = LocalizedFirst;
  this->m_bMatchUnderlineStrikethroughAndPointSize = false;
  (this->m_by_index)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008219c0;
  (this->m_by_index).m_a = (ON_Font **)0x0;
  (this->m_by_index).m_count = 0;
  (this->m_by_index).m_capacity = 0;
  (this->m_unsorted)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008219c0;
  (this->m_unsorted).m_a = (ON_Font **)0x0;
  (this->m_unsorted).m_count = 0;
  (this->m_unsorted).m_capacity = 0;
  this_00 = (ON_FontListImpl *)operator_new(0xc0);
  memset(this_00,0,0xc0);
  ON_FontListImpl::ON_FontListImpl(this_00);
  this->m_sorted = this_00;
  memset(this->m_reserved,0,0xa0);
  (this->m_quartet_list)._vptr_ON_ClassArray = (_func_int **)&PTR__ON_ClassArray_00821ae0;
  (this->m_quartet_list).m_a = (ON_FontFaceQuartet *)0x0;
  (this->m_quartet_list).m_count = 0;
  (this->m_quartet_list).m_capacity = 0;
  return;
}

Assistant:

ON_FontList::ON_FontList()
  : m_sorted(*(new ON_FontListImpl()))
{}